

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZTensor<TFad<6,_double>_>,_3>::TPZManVector
          (TPZManVector<TPZTensor<TFad<6,_double>_>,_3> *this,
          TPZManVector<TPZTensor<TFad<6,_double>_>,_3> *copy)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong *puVar4;
  TPZTensor<TFad<6,_double>_> *pTVar5;
  TPZTensor<TFad<6,_double>_> *pTVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = 0;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore = (TPZTensor<TFad<6,_double>_> *)0x0;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements = 0;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_016ad290;
  pTVar6 = this->fExtAlloc;
  lVar7 = 0;
  pTVar5 = pTVar6;
  do {
    TPZTensor<TFad<6,_double>_>::TPZTensor(pTVar5);
    lVar7 = lVar7 + -0x1a8;
    pTVar5 = pTVar5 + 1;
  } while (lVar7 != -0x4f8);
  uVar1 = (copy->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements;
  if ((long)uVar1 < 4) {
    uVar8 = 0;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    uVar3 = SUB168(auVar2 * ZEXT816(0x1a8),0);
    uVar8 = uVar3 + 8;
    if (0xfffffffffffffff7 < uVar3) {
      uVar8 = 0xffffffffffffffff;
    }
    if (SUB168(auVar2 * ZEXT816(0x1a8),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    puVar4 = (ulong *)operator_new__(uVar8);
    *puVar4 = uVar1;
    pTVar6 = (TPZTensor<TFad<6,_double>_> *)(puVar4 + 1);
    lVar7 = 0;
    pTVar5 = pTVar6;
    do {
      TPZTensor<TFad<6,_double>_>::TPZTensor(pTVar5);
      lVar7 = lVar7 + -0x1a8;
      pTVar5 = pTVar5 + 1;
      uVar8 = uVar1;
    } while (uVar1 * -0x1a8 - lVar7 != 0);
  }
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore = pTVar6;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements = uVar1;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = uVar8;
  uVar8 = 0;
  if (0 < (long)uVar1) {
    uVar8 = uVar1;
  }
  lVar7 = 8;
  while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
    TPZManVector<TFad<6,_double>,_6>::operator=
              ((TPZManVector<TFad<6,_double>,_6> *)
               ((long)(((this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore)->fData).fExtAlloc
                      [0].dx_ + lVar7 + -0x38),
               (TPZManVector<TFad<6,_double>,_6> *)
               ((long)(((copy->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore)->fData).fExtAlloc
                      [0].dx_ + lVar7 + -0x38));
    lVar7 = lVar7 + 0x1a8;
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(const TPZManVector< T, NumExtAlloc >& copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy.fStore[i];
    }
}